

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int luaH_psetshortstr(Table *t,TString *key,TValue *val)

{
  int iVar1;
  TValue *slot_00;
  TString *x_;
  TValue *io;
  TValue tk;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  TValue *val_local;
  TString *key_local;
  Table *t_local;
  
  slot_00 = luaH_Hgetshortstr(t,key);
  if ((slot_00->tt_ & 0xf) == 0) {
    if ((t->metatable == (Table *)0x0) || ((t->metatable->flags & 2) != 0)) {
      if ((val->tt_ & 0xf) == 0) {
        return 0;
      }
      if ((slot_00->tt_ == ' ') && (((t->marked & 0x20) == 0 || ((key->marked & 0x18) == 0)))) {
        tk.value_.ub = key->tt | 0x40;
        io = (TValue *)key;
        iVar1 = insertkey(t,(TValue *)&io,val);
        if (iVar1 != 0) {
          t->flags = t->flags & 0xc0;
          return 0;
        }
      }
    }
    t_local._4_4_ = retpsetcode(t,slot_00);
  }
  else {
    slot_00->value_ = val->value_;
    slot_00->tt_ = val->tt_;
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int luaH_psetshortstr (Table *t, TString *key, TValue *val) {
  const TValue *slot = luaH_Hgetshortstr(t, key);
  if (!ttisnil(slot)) {  /* key already has a value? (all too common) */
    setobj(((lua_State*)NULL), cast(TValue*, slot), val);  /* update it */
    return HOK;  /* done */
  }
  else if (checknoTM(t->metatable, TM_NEWINDEX)) {  /* no metamethod? */
    if (ttisnil(val))  /* new value is nil? */
      return HOK;  /* done (value is already nil/absent) */
    if (isabstkey(slot) &&  /* key is absent? */
       !(isblack(t) && iswhite(key))) {  /* and don't need barrier? */
      TValue tk;  /* key as a TValue */
      setsvalue(cast(lua_State *, NULL), &tk, key);
      if (insertkey(t, &tk, val)) {  /* insert key, if there is space */
        invalidateTMcache(t);
        return HOK;
      }
    }
  }
  /* Else, either table has new-index metamethod, or it needs barrier,
     or it needs to rehash for the new key. In any of these cases, the
     operation cannot be completed here. Return a code for the caller. */
  return retpsetcode(t, slot);
}